

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O0

SCC * __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::GetSCC
          (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this,
          Descriptor *descriptor)

{
  size_type sVar1;
  mapped_type *pmVar2;
  NodeData NVar3;
  SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *local_30;
  Descriptor *local_20;
  Descriptor *descriptor_local;
  SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this_local;
  
  local_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  sVar1 = std::
          map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
          ::count(&this->cache_,&local_20);
  if (sVar1 == 0) {
    NVar3 = DFS(this,local_20);
    local_30 = (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *)
               NVar3.scc;
    this_local = local_30;
  }
  else {
    pmVar2 = std::
             map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
             ::operator[](&this->cache_,&local_20);
    this_local = (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>
                  *)pmVar2->scc;
  }
  return (SCC *)this_local;
}

Assistant:

const SCC* GetSCC(const Descriptor* descriptor) {
    if (cache_.count(descriptor)) return cache_[descriptor].scc;
    return DFS(descriptor).scc;
  }